

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int store_char(char c,char **buf,int *buf_len,int *used)

{
  char *pcVar1;
  size_t __size;
  
  if (*used == *buf_len) {
    __size = (long)*buf_len + 0x10;
    *buf_len = (int)__size;
    pcVar1 = (char *)realloc(*buf,__size);
    if (pcVar1 == (char *)0x0) {
      store_char_cold_1();
      return -1;
    }
    *buf = pcVar1;
  }
  (*buf)[*used] = c;
  *used = *used + 1;
  return 0;
}

Assistant:

static int
store_char(char c, char **buf, int *buf_len, int *used)
{
    char *new_buf;

    if (*used == *buf_len) {
        *buf_len += 16;
        new_buf = realloc(*buf, *buf_len * sizeof *new_buf);
        if (!new_buf) {
            fprintf(stderr, "Memory allocation error (%s).\n", strerror(errno));
            return -1;
        }
        *buf = new_buf;
    }

    (*buf)[*used] = c;
    ++(*used);
    return 0;
}